

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

int __thiscall sf::Shader::getUniformLocation(Shader *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Rb_tree_color _Var3;
  iterator iVar4;
  ostream *poVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_uniforms)._M_t,name);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->m_uniforms)._M_t._M_impl.super__Rb_tree_header) {
    _Var3 = (*sf_glad_glGetUniformLocationARB)(this->m_shaderProgram,(name->_M_dataplus)._M_p);
    paVar1 = &local_50.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    local_50.second = _Var3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->m_uniforms,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    if (_Var3 == ~_S_red) {
      poVar5 = err();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Uniform \"",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" not found in shader",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  else {
    _Var3 = iVar4._M_node[2]._M_color;
  }
  return _Var3;
}

Assistant:

int Shader::getUniformLocation(const std::string& name)
{
    // Check the cache
    UniformTable::const_iterator it = m_uniforms.find(name);
    if (it != m_uniforms.end())
    {
        // Already in cache, return it
        return it->second;
    }
    else
    {
        // Not in cache, request the location from OpenGL
        int location = GLEXT_glGetUniformLocation(castToGlHandle(m_shaderProgram), name.c_str());
        m_uniforms.insert(std::make_pair(name, location));

        if (location == -1)
            err() << "Uniform \"" << name << "\" not found in shader" << std::endl;

        return location;
    }
}